

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

Vec_Int_t * Gia_ManOrderWithBoxes(Gia_Man_t *p)

{
  uint iCiNum_00;
  Tim_Man_t *p_00;
  int iVar1;
  uint iBox;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar5;
  int iBoxNum;
  int iCiNum;
  int curCo;
  int curCi;
  int k;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Tim_Man_t *pManTime;
  Gia_Man_t *p_local;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  if (p_00 == (Tim_Man_t *)0x0) {
    __assert_fail("pManTime != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                  ,0x11f,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  iVar1 = Gia_ManIsNormalized(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized( p )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                  ,0x120,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntAlloc(iVar1);
  Vec_IntPush(p_01,0);
  pGVar5 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar5);
  for (curCi = 0; iVar1 = Tim_ManPiNum(p_00), curCi < iVar1; curCi = curCi + 1) {
    pGVar5 = Gia_ManCi(p,curCi);
    iVar1 = Gia_ObjId(p,pGVar5);
    Vec_IntPush(p_01,iVar1);
    Gia_ObjSetTravIdCurrent(p,pGVar5);
    iVar1 = Gia_ObjId(p,pGVar5);
    if (iVar1 != curCi + 1) {
      __assert_fail("Gia_ObjId(p, pObj) == i+1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                    ,0x12e,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
    }
  }
  iCiNum = Tim_ManPiNum(p_00);
  iBoxNum = 0;
  for (curCi = 0; iVar1 = Tim_ManBoxNum(p_00), curCi < iVar1; curCi = curCi + 1) {
    for (curCo = 0; iVar1 = Tim_ManBoxInputNum(p_00,curCi), curCo < iVar1; curCo = curCo + 1) {
      pGVar5 = Gia_ManCo(p,iBoxNum + curCo);
      pGVar5 = Gia_ObjFanin0(pGVar5);
      iVar1 = Gia_ManOrderWithBoxes_rec(p,pGVar5,p_01);
      if (iVar1 != 0) {
        iCiNum_00 = p->iData2;
        iBox = Tim_ManBoxFindFromCiNum(p_00,iCiNum_00);
        printf("The command has to terminate. Boxes are not in a topological order.\n");
        printf("The following information may help debugging (numbers are 0-based):\n");
        uVar2 = Tim_ManBoxOutputFirst(p_00,curCi);
        uVar3 = Tim_ManBoxInputFirst(p_00,curCi);
        printf("Input %d of BoxA %d (1stCI = %d; 1stCO = %d) has TFI with CI %d,\n",
               (ulong)(uint)curCo,(ulong)(uint)curCi,(ulong)uVar2,(ulong)uVar3,(ulong)iCiNum_00);
        iVar1 = Tim_ManBoxOutputFirst(p_00,iBox);
        uVar2 = Tim_ManBoxOutputFirst(p_00,iBox);
        uVar3 = Tim_ManBoxInputFirst(p_00,iBox);
        printf("which corresponds to output %d of BoxB %d (1stCI = %d; 1stCO = %d).\n",
               (ulong)(iCiNum_00 - iVar1),(ulong)iBox,(ulong)uVar2,(ulong)uVar3);
        printf("In a correct topological order, BoxB should precede BoxA.\n");
        Vec_IntFree(p_01);
        p->iData2 = 0;
        return (Vec_Int_t *)0x0;
      }
    }
    for (curCo = 0; iVar1 = Tim_ManBoxInputNum(p_00,curCi), curCo < iVar1; curCo = curCo + 1) {
      pGVar5 = Gia_ManCo(p,iBoxNum + curCo);
      iVar1 = Gia_ObjId(p,pGVar5);
      Vec_IntPush(p_01,iVar1);
    }
    iVar1 = Tim_ManBoxInputNum(p_00,curCi);
    iBoxNum = iVar1 + iBoxNum;
    for (curCo = 0; iVar1 = Tim_ManBoxOutputNum(p_00,curCi), curCo < iVar1; curCo = curCo + 1) {
      pGVar5 = Gia_ManCi(p,iCiNum + curCo);
      iVar1 = Gia_ObjId(p,pGVar5);
      Vec_IntPush(p_01,iVar1);
      Gia_ObjSetTravIdCurrent(p,pGVar5);
    }
    iVar1 = Tim_ManBoxOutputNum(p_00,curCi);
    iCiNum = iVar1 + iCiNum;
  }
  iVar1 = Tim_ManCoNum(p_00);
  iVar4 = Tim_ManPoNum(p_00);
  for (curCi = iVar1 - iVar4; iVar1 = Tim_ManCoNum(p_00), curCi < iVar1; curCi = curCi + 1) {
    pGVar5 = Gia_ManCo(p,curCi);
    pGVar5 = Gia_ObjFanin0(pGVar5);
    Gia_ManOrderWithBoxes_rec(p,pGVar5,p_01);
  }
  iVar1 = Tim_ManCoNum(p_00);
  iVar4 = Tim_ManPoNum(p_00);
  for (curCi = iVar1 - iVar4; iVar1 = Tim_ManCoNum(p_00), curCi < iVar1; curCi = curCi + 1) {
    pGVar5 = Gia_ManCo(p,curCi);
    iVar1 = Gia_ObjId(p,pGVar5);
    Vec_IntPush(p_01,iVar1);
  }
  iVar1 = Tim_ManPoNum(p_00);
  iVar4 = Gia_ManCiNum(p);
  if (iCiNum == iVar4) {
    iVar4 = Gia_ManCoNum(p);
    if (iVar1 + iBoxNum != iVar4) {
      __assert_fail("curCo == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                    ,0x169,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
    }
    iVar1 = Vec_IntSize(p_01);
    iVar4 = Gia_ManObjNum(p);
    if (iVar1 == iVar4) {
      return p_01;
    }
    __assert_fail("Vec_IntSize(vNodes) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                  ,0x16a,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
  }
  __assert_fail("curCi == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTim.c"
                ,0x168,"Vec_Int_t *Gia_ManOrderWithBoxes(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManOrderWithBoxes( Gia_Man_t * p )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i, k, curCi, curCo;
    assert( pManTime != NULL );
    assert( Gia_ManIsNormalized( p ) );
    // start trav IDs
    Gia_ManIncrementTravId( p );
    // start the array
    vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    // include constant
    Vec_IntPush( vNodes, 0 );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    // include primary inputs
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        Gia_ObjSetTravIdCurrent( p, pObj );
        assert( Gia_ObjId(p, pObj) == i+1 );
    }
    // for each box, include box nodes
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        // add internal nodes
        for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
            {
                int iCiNum  = p->iData2;
                int iBoxNum = Tim_ManBoxFindFromCiNum( pManTime, iCiNum );
                printf( "The command has to terminate. Boxes are not in a topological order.\n" );
                printf( "The following information may help debugging (numbers are 0-based):\n" );
                printf( "Input %d of BoxA %d (1stCI = %d; 1stCO = %d) has TFI with CI %d,\n", 
                    k, i, Tim_ManBoxOutputFirst(pManTime, i), Tim_ManBoxInputFirst(pManTime, i), iCiNum );
                printf( "which corresponds to output %d of BoxB %d (1stCI = %d; 1stCO = %d).\n", 
                    iCiNum - Tim_ManBoxOutputFirst(pManTime, iBoxNum), iBoxNum, 
                    Tim_ManBoxOutputFirst(pManTime, iBoxNum), Tim_ManBoxInputFirst(pManTime, iBoxNum) );
                printf( "In a correct topological order, BoxB should precede BoxA.\n" );
                Vec_IntFree( vNodes );
                p->iData2 = 0;
                return NULL;
            }
        }
        // add POs corresponding to box inputs
        for ( k = 0; k < Tim_ManBoxInputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        }
        curCo += Tim_ManBoxInputNum(pManTime, i);
        // add PIs corresponding to box outputs
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, i); k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
            Gia_ObjSetTravIdCurrent( p, pObj );
        }
        curCi += Tim_ManBoxOutputNum(pManTime, i);
    }
    // add remaining nodes
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes );
    }
    // add POs
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
    assert( Vec_IntSize(vNodes) == Gia_ManObjNum(p) );
    return vNodes;
}